

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void __thiscall libtorrent::aux::utp_socket_impl::socket_drained(utp_socket_impl *this)

{
  error_code local_30;
  error_code local_20;
  utp_socket_impl *local_10;
  utp_socket_impl *this_local;
  
  *(ushort *)&this->field_0x21c = *(ushort *)&this->field_0x21c & 0xdfff;
  local_10 = this;
  boost::system::error_code::error_code(&local_20);
  maybe_trigger_receive_callback(this,&local_20);
  boost::system::error_code::error_code(&local_30);
  maybe_trigger_send_callback(this,&local_30);
  return;
}

Assistant:

void utp_socket_impl::socket_drained()
{
	m_subscribe_drained = false;

	// at this point, we know we won't receive any
	// more packets this round. So, we may want to
	// call the receive callback function to
	// let the user consume it
	maybe_trigger_receive_callback({});
	maybe_trigger_send_callback({});
}